

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O1

wchar_t archive_write_disk_set_user_lookup
                  (archive *_a,void *private_data,
                  _func_int64_t_void_ptr_char_ptr_int64_t *lookup_uid,
                  _func_void_void_ptr *cleanup_uid)

{
  int iVar1;
  wchar_t wVar2;
  
  iVar1 = __archive_check_magic(_a,0xc001b0c5,0x7fff,"archive_write_disk_set_user_lookup");
  wVar2 = L'\xffffffe2';
  if (iVar1 != -0x1e) {
    if (((code *)_a[1].read_data_block != (code *)0x0) && (_a[1].read_data_offset != 0)) {
      (*(code *)_a[1].read_data_block)();
    }
    _a[1].sconv = (archive_string_conv *)lookup_uid;
    _a[1].read_data_block = (char *)cleanup_uid;
    _a[1].read_data_offset = (int64_t)private_data;
    wVar2 = L'\0';
  }
  return wVar2;
}

Assistant:

int
archive_write_disk_set_user_lookup(struct archive *_a,
    void *private_data,
    int64_t (*lookup_uid)(void *private, const char *uname, int64_t uid),
    void (*cleanup_uid)(void *private))
{
	struct archive_write_disk *a = (struct archive_write_disk *)_a;
	archive_check_magic(&a->archive, ARCHIVE_WRITE_DISK_MAGIC,
	    ARCHIVE_STATE_ANY, "archive_write_disk_set_user_lookup");

	if (a->cleanup_uid != NULL && a->lookup_uid_data != NULL)
		(a->cleanup_uid)(a->lookup_uid_data);

	a->lookup_uid = lookup_uid;
	a->cleanup_uid = cleanup_uid;
	a->lookup_uid_data = private_data;
	return (ARCHIVE_OK);
}